

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O3

void pnga_gather2d(Integer g_a,void *v,Integer *i,Integer *j,Integer nv)

{
  global_array_t *pgVar1;
  short sVar2;
  int iVar3;
  C_Integer *pCVar4;
  long lVar5;
  Integer IVar6;
  int iVar7;
  void *__ptr;
  logical lVar8;
  long lVar9;
  long *plVar10;
  long lVar11;
  ulong uVar12;
  undefined4 uVar13;
  int iVar14;
  long lVar15;
  long *plVar16;
  long lVar17;
  void **ppvVar18;
  Integer IVar19;
  long lVar20;
  long lVar21;
  uint uVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  C_Integer CVar27;
  Integer _dim;
  long lVar28;
  global_array_t *pgVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long icode;
  long lVar34;
  bool bVar35;
  armci_giov_t desc;
  Integer subscrpt [2];
  Integer hi [2];
  Integer lo [2];
  Integer _lo [2];
  char err_string [256];
  
  if (nv < 1) {
    return;
  }
  lVar34 = g_a + 1000;
  if ((g_a < -1000) || (_max_global_array <= lVar34)) {
    sprintf(err_string,"%s: INVALID ARRAY HANDLE","ga_gather");
    pnga_error(err_string,g_a);
  }
  if (GA[lVar34].actv == 0) {
    sprintf(err_string,"%s: ARRAY NOT ACTIVE","ga_gather");
    pnga_error(err_string,g_a);
  }
  GAstat.numgat = GAstat.numgat + 1;
  iVar3 = GA[lVar34].p_handle;
  lVar31 = (long)iVar3;
  if (lVar31 < 0) {
    lVar30 = GA[lVar34].num_rstrctd;
    if (GA[lVar34].num_rstrctd < 1) {
      lVar30 = GAnproc;
    }
  }
  else {
    lVar30 = (long)PGRP_LIST[lVar31].map_nproc;
  }
  if (GA[lVar34].distr_type == 0) {
    __ptr = malloc((nv << 0x20) + (lVar30 << 0x22) >> 0x1d);
    lVar32 = 0;
    if (__ptr == (void *)0x0) {
      lVar32 = 0;
      lVar21 = lVar30;
      goto LAB_00177655;
    }
  }
  else {
    lVar32 = GA[lVar34].block_total;
    __ptr = malloc((nv << 0x20) + (lVar32 << 0x22) >> 0x1d);
    lVar21 = lVar32;
    if (__ptr == (void *)0x0) {
LAB_00177655:
      pnga_error("malloc failed",lVar21 * 3);
      __ptr = (void *)0x0;
    }
  }
  pgVar29 = GA;
  bVar35 = GA[lVar34].distr_type == 0;
  lVar21 = lVar32;
  if (bVar35) {
    lVar21 = lVar30;
  }
  lVar5 = lVar21 * 8 + nv * 8;
  if (bVar35) {
    if (0 < lVar30) {
      lVar15 = 0;
      do {
        *(undefined8 *)((long)__ptr + lVar15 * 8 + nv * 8) = 0;
        *(undefined8 *)((long)__ptr + lVar15 * 8 + lVar5) = 0;
        lVar15 = lVar15 + 1;
      } while (lVar30 != lVar15);
    }
  }
  else if (0 < lVar32) {
    lVar15 = 0;
    do {
      *(undefined8 *)((long)__ptr + lVar15 * 8 + nv * 8) = 0;
      *(undefined8 *)((long)__ptr + lVar15 * 8 + lVar5) = 0;
      lVar15 = lVar15 + 1;
    } while (lVar32 != lVar15);
  }
  if (pgVar29[lVar34].num_rstrctd == 0) {
    lVar15 = 0;
    IVar19 = nv;
    do {
      subscrpt[0] = *(Integer *)((long)i + lVar15);
      subscrpt[1] = *(Integer *)((long)j + lVar15);
      lVar8 = pnga_locate(g_a,subscrpt,(Integer *)((long)__ptr + lVar15));
      if (lVar8 == 0) {
        sprintf(err_string,"invalid i/j=(%ld,%ld)",*(undefined8 *)((long)i + lVar15),
                *(undefined8 *)((long)j + lVar15));
        pnga_error(err_string,g_a);
      }
      plVar10 = (long *)((long)__ptr + *(Integer *)((long)__ptr + lVar15) * 8 + lVar5);
      *plVar10 = *plVar10 + 1;
      lVar15 = lVar15 + 8;
      IVar19 = IVar19 + -1;
      pgVar29 = GA;
    } while (IVar19 != 0);
  }
  else {
    lVar15 = 0;
    IVar19 = nv;
    do {
      subscrpt[0] = *(Integer *)((long)i + lVar15);
      subscrpt[1] = *(Integer *)((long)j + lVar15);
      lVar8 = pnga_locate(g_a,subscrpt,(Integer *)((long)__ptr + lVar15));
      if (lVar8 == 0) {
        sprintf(err_string,"invalid i/j=(%ld,%ld)",*(undefined8 *)((long)i + lVar15),
                *(undefined8 *)((long)j + lVar15));
        pnga_error(err_string,g_a);
      }
      pgVar29 = GA;
      plVar10 = (long *)((long)__ptr +
                        GA[lVar34].rank_rstrctd[*(Integer *)((long)__ptr + lVar15)] * 8 + lVar5);
      *plVar10 = *plVar10 + 1;
      lVar15 = lVar15 + 8;
      IVar19 = IVar19 + -1;
    } while (IVar19 != 0);
  }
  lVar15 = lVar21 * 0x10 + nv * 8;
  lVar21 = lVar21 * 0x18 + nv * 8;
  iVar14 = pgVar29[lVar34].distr_type;
  if (iVar14 == 0) {
    if (0 < lVar30) {
      lVar32 = 0;
      icode = 0;
      do {
        if (0 < *(long *)((long)__ptr + lVar32 * 8 + lVar5)) {
          *(long *)((long)__ptr + icode * 8 + lVar15) = lVar32;
          *(long *)((long)__ptr + lVar32 * 8 + lVar21) = icode;
          icode = icode + 1;
        }
        lVar32 = lVar32 + 1;
      } while (lVar30 != lVar32);
      goto LAB_00177949;
    }
  }
  else if (0 < lVar32) {
    lVar9 = 0;
    icode = 0;
    do {
      if (0 < *(long *)((long)__ptr + lVar9 * 8 + lVar5)) {
        *(long *)((long)__ptr + icode * 8 + lVar15) = lVar9;
        *(long *)((long)__ptr + lVar9 * 8 + lVar21) = icode;
        icode = icode + 1;
      }
      lVar9 = lVar9 + 1;
    } while (lVar32 != lVar9);
    goto LAB_00177949;
  }
  icode = 0;
LAB_00177949:
  GAstat.numgat_procs = GAstat.numgat_procs + icode;
  lVar32 = nv * 0x10;
  plVar10 = (long *)malloc((long)((int)icode * 0x38 + (int)lVar32 + (int)(icode * 8)));
  if (plVar10 == (long *)0x0) {
    pnga_error("malloc failed",icode);
    iVar14 = GA[lVar34].distr_type;
    pgVar29 = GA;
  }
  plVar16 = plVar10 + icode * 2;
  lVar9 = icode * 8 + lVar32;
  lVar23 = icode * 8 + lVar9;
  lVar33 = icode * 8 + lVar23;
  lVar11 = icode * 8 + lVar33;
  if (iVar14 == 0) {
    if (0 < icode) {
      lVar32 = 0;
      do {
        lVar9 = *(long *)((long)__ptr + lVar32 * 8 + lVar15);
        if (0 < pgVar29[lVar34].num_rstrctd) {
          lVar9 = pgVar29[lVar34].rstrctd_list[lVar9];
        }
        pnga_distribution(g_a,lVar9,lo,hi);
        plVar16[nv * 2 + icode + lVar32] = lo[0];
        plVar16[nv * 2 + icode * 3 + lVar32] = lo[1];
        plVar16[nv * 2 + icode * 2 + lVar32] = hi[0];
        plVar16[nv * 2 + icode * 4 + lVar32] = hi[1];
        pgVar29 = GA;
        pgVar1 = GA + lVar34;
        lVar9 = GA[lVar34].width[0];
        lVar23 = GA[lVar34].width[1];
        lVar33 = GA[lVar34].num_rstrctd;
        iVar14 = GA[lVar34].distr_type;
        if (iVar14 - 1U < 3) {
          sVar2 = pgVar1->ndim;
          uVar22 = (uint)sVar2;
          lVar11 = *(long *)((long)__ptr + lVar32 * 8 + lVar15);
          lVar20 = pgVar1->num_blocks[0];
          lVar28 = (long)(int)lVar11 % lVar20;
          uVar13 = (undefined4)lVar28;
          err_string[0] = (char)uVar13;
          err_string[1] = (char)((uint)uVar13 >> 8);
          err_string[2] = (char)((uint)uVar13 >> 0x10);
          err_string[3] = (char)((uint)uVar13 >> 0x18);
          if (1 < (int)uVar22) {
            lVar26 = 0;
            do {
              lVar11 = (long)((int)lVar11 - (int)lVar28) / lVar20;
              lVar20 = GA[g_a + 1000].num_blocks[lVar26 + 1];
              lVar28 = (long)(int)lVar11 % lVar20;
              *(int *)(err_string + lVar26 * 4 + 4) = (int)lVar28;
              lVar26 = lVar26 + 1;
            } while ((ulong)uVar22 - 1 != lVar26);
          }
          if (0 < sVar2) {
            lVar11 = 0;
            do {
              iVar14 = *(int *)(err_string + lVar11);
              lVar20 = *(long *)((long)GA[g_a + 1000].block_dims + lVar11 * 2);
              *(long *)((long)_lo + lVar11 * 2) = lVar20 * iVar14 + 1;
              lVar20 = ((long)iVar14 + 1) * lVar20;
              lVar28 = *(long *)((long)GA[g_a + 1000].dims + lVar11 * 2);
              if (lVar28 <= lVar20) {
                lVar20 = lVar28;
              }
              *(long *)((long)&desc.src_ptr_array + lVar11 * 2) = lVar20;
              lVar11 = lVar11 + 4;
            } while ((ulong)uVar22 << 2 != lVar11);
          }
        }
        else if (iVar14 == 4) {
          sVar2 = pgVar1->ndim;
          uVar22 = (uint)sVar2;
          lVar11 = *(long *)((long)__ptr + lVar32 * 8 + lVar15);
          lVar20 = pgVar1->num_blocks[0];
          lVar28 = (long)(int)lVar11 % lVar20;
          uVar13 = (undefined4)lVar28;
          err_string[0] = (char)uVar13;
          err_string[1] = (char)((uint)uVar13 >> 8);
          err_string[2] = (char)((uint)uVar13 >> 0x10);
          err_string[3] = (char)((uint)uVar13 >> 0x18);
          if (1 < (int)uVar22) {
            lVar26 = 0;
            do {
              lVar11 = (long)((int)lVar11 - (int)lVar28) / lVar20;
              lVar20 = GA[g_a + 1000].num_blocks[lVar26 + 1];
              lVar28 = (long)(int)lVar11 % lVar20;
              *(int *)(err_string + lVar26 * 4 + 4) = (int)lVar28;
              lVar26 = lVar26 + 1;
            } while ((ulong)uVar22 - 1 != lVar26);
          }
          if (0 < sVar2) {
            pCVar4 = GA[lVar34].mapc;
            lVar11 = 0;
            iVar14 = 0;
            do {
              iVar7 = *(int *)(err_string + lVar11);
              lVar28 = (long)iVar14 + (long)iVar7;
              *(C_Integer *)((long)_lo + lVar11 * 2) = pCVar4[lVar28];
              lVar20 = *(long *)((long)pgVar1->num_blocks + lVar11 * 2);
              if ((long)iVar7 < lVar20 + -1) {
                lVar28 = pCVar4[lVar28 + 1] + -1;
              }
              else {
                lVar28 = *(long *)((long)pgVar1->dims + lVar11 * 2);
              }
              *(long *)((long)&desc.src_ptr_array + lVar11 * 2) = lVar28;
              iVar14 = iVar14 + (int)lVar20;
              lVar11 = lVar11 + 4;
            } while ((ulong)uVar22 << 2 != lVar11);
          }
        }
        else if (iVar14 == 0) {
          if (lVar33 == 0) {
            lVar11 = (long)pgVar1->ndim;
            if (0 < lVar11) {
              lVar20 = 1;
              lVar28 = 0;
              do {
                lVar20 = lVar20 * GA[g_a + 1000].nblock[lVar28];
                lVar28 = lVar28 + 1;
              } while (lVar11 != lVar28);
              lVar28 = *(long *)((long)__ptr + lVar32 * 8 + lVar15);
              if (lVar28 < 0 || lVar20 <= lVar28) goto LAB_00177ec4;
              if (0 < pgVar1->ndim) {
                pCVar4 = pgVar1->mapc;
                lVar20 = 0;
                lVar26 = 0;
                do {
                  lVar25 = (long)GA[g_a + 1000].nblock[lVar20];
                  lVar17 = lVar28 % lVar25;
                  _lo[lVar20] = pCVar4[lVar17 + lVar26];
                  if (lVar17 == lVar25 + -1) {
                    ppvVar18 = (void **)GA[g_a + 1000].dims[lVar20];
                  }
                  else {
                    ppvVar18 = (void **)(pCVar4[lVar17 + lVar26 + 1] + -1);
                  }
                  lVar26 = lVar26 + lVar25;
                  (&desc.src_ptr_array)[lVar20] = ppvVar18;
                  lVar20 = lVar20 + 1;
                  lVar28 = lVar28 / lVar25;
                } while (lVar11 != lVar20);
              }
            }
          }
          else {
            lVar20 = *(long *)((long)__ptr + lVar32 * 8 + lVar15);
            sVar2 = pgVar1->ndim;
            lVar11 = (long)sVar2;
            if (lVar20 < lVar33) {
              if (0 < sVar2) {
                lVar28 = 1;
                lVar26 = 0;
                do {
                  lVar28 = lVar28 * GA[g_a + 1000].nblock[lVar26];
                  lVar26 = lVar26 + 1;
                } while (lVar11 != lVar26);
                if ((lVar20 < 0) || (lVar28 <= lVar20)) goto LAB_00177ec4;
                if (0 < sVar2) {
                  pCVar4 = pgVar1->mapc;
                  lVar28 = 0;
                  lVar26 = 0;
                  do {
                    lVar25 = (long)GA[g_a + 1000].nblock[lVar26];
                    lVar17 = lVar20 % lVar25;
                    _lo[lVar26] = pCVar4[lVar17 + lVar28];
                    if (lVar17 == lVar25 + -1) {
                      ppvVar18 = (void **)GA[g_a + 1000].dims[lVar26];
                    }
                    else {
                      ppvVar18 = (void **)(pCVar4[lVar17 + lVar28 + 1] + -1);
                    }
                    lVar28 = lVar28 + lVar25;
                    (&desc.src_ptr_array)[lVar26] = ppvVar18;
                    lVar26 = lVar26 + 1;
                    lVar20 = lVar20 / lVar25;
                  } while (lVar11 != lVar26);
                }
              }
            }
            else {
LAB_00177ec4:
              if (0 < (short)lVar11) {
                memset(_lo,0,lVar11 << 3);
                memset(&desc,0xff,lVar11 << 3);
              }
            }
          }
        }
        IVar6 = _lo[1];
        IVar19 = _lo[0];
        ppvVar18 = desc.src_ptr_array;
        if (pgVar1->p_handle == 0) {
          CVar27 = (C_Integer)
                   PGRP_LIST->inv_map_proc_list[*(long *)((long)__ptr + lVar32 * 8 + lVar15)];
        }
        else {
          CVar27 = *(long *)((long)__ptr + lVar32 * 8 + lVar15);
          if (lVar33 != 0) {
            CVar27 = pgVar1->rstrctd_list[CVar27];
          }
        }
        lVar33 = plVar16[nv * 2 + icode + lVar32];
        lVar11 = plVar16[nv * 2 + icode * 3 + lVar32];
        if (((long)desc.src_ptr_array < lVar33 || lVar33 < _lo[0]) ||
           ((long)desc.dst_ptr_array < lVar11 || lVar11 < _lo[1])) {
          sprintf(err_string,"%s:p=%ld invalid i/j (%ld,%ld)><(%ld:%ld,%ld:%ld)","gaShmemLocation");
          pnga_error(err_string,g_a);
          lVar33 = plVar16[nv * 2 + icode + lVar32];
          lVar11 = plVar16[nv * 2 + icode * 3 + lVar32];
          pgVar29 = GA;
        }
        lVar20 = ((lVar9 * 2 + 1) - IVar19) + (long)ppvVar18;
        plVar16[nv * 2 + lVar32] =
             (long)(pgVar29[lVar34].ptr[CVar27] +
                   ((lVar9 - IVar19) + lVar33 + ((lVar23 - IVar6) + lVar11) * lVar20) *
                   *(long *)(BYTE_ARRAY_001d2351 + (long)pgVar29[lVar34].type * 0x10 + 0x237));
        plVar16[nv * 2 + icode * 5 + lVar32] = lVar20;
        lVar32 = lVar32 + 1;
      } while (lVar32 != icode);
    }
  }
  else if (0 < icode) {
    lVar28 = 0;
    lVar20 = icode;
    do {
      IVar19 = *(Integer *)((long)__ptr + lVar28 + lVar15);
      pnga_distribution(g_a,IVar19,lo,hi);
      *(Integer *)((long)plVar16 + lVar28 + lVar9) = lo[0];
      *(Integer *)((long)plVar16 + lVar28 + lVar33) = lo[1];
      *(Integer *)((long)plVar16 + lVar28 + lVar23) = hi[0];
      *(Integer *)((long)plVar16 + lVar28 + lVar11) = hi[1];
      pnga_access_block_ptr
                (g_a,IVar19,(void *)((long)plVar16 + lVar28 + lVar32),
                 (Integer *)((long)plVar16 + lVar28 + icode * 8 + lVar11));
      lVar28 = lVar28 + 8;
      lVar20 = lVar20 + -1;
      pgVar29 = GA;
    } while (lVar20 != 0);
  }
  iVar14 = pgVar29[lVar34].elemsize;
  GAbytes.gattot = (double)iVar14 * (double)nv + GAbytes.gattot;
  GAbytes.gatloc =
       (double)iVar14 *
       (double)*(long *)((long)__ptr + *(long *)((long)__ptr + GAme * 8) * 8 + lVar5) +
       GAbytes.gatloc;
  *plVar10 = (long)plVar16;
  plVar10[icode] = (long)(plVar16 + nv);
  if (1 < icode) {
    lVar32 = *plVar10;
    lVar9 = plVar10[icode];
    lVar23 = 0;
    do {
      lVar33 = *(long *)((long)__ptr + *(long *)((long)__ptr + lVar23 * 8 + lVar15) * 8 + lVar5);
      lVar32 = lVar32 + lVar33 * 8;
      plVar10[lVar23 + 1] = lVar32;
      lVar9 = lVar9 + lVar33 * 8;
      plVar10[icode + lVar23 + 1] = lVar9;
      lVar23 = lVar23 + 1;
    } while (icode + -1 != lVar23);
  }
  lVar32 = 0;
  do {
    lVar9 = *(long *)((long)__ptr + lVar32 * 8);
    if (0 < GA[lVar34].num_rstrctd) {
      lVar9 = GA[lVar34].rank_rstrctd[lVar9];
    }
    lVar23 = *(long *)((long)__ptr + lVar9 * 8 + nv * 8);
    *(long *)((long)__ptr + lVar9 * 8 + nv * 8) = lVar23 + 1;
    uVar12 = *(ulong *)((long)__ptr + lVar9 * 8 + lVar21);
    *(void **)(plVar10[icode + uVar12] + lVar23 * 8) = v;
    lVar9 = i[lVar32];
    lVar33 = plVar16[nv * 2 + icode + uVar12];
    if ((lVar9 < lVar33) || (plVar16[nv * 2 + icode * 2 + uVar12] < lVar9)) {
LAB_0017825b:
      sprintf(err_string,"proc=%d invalid i/j=(%ld,%ld)><[%ld:%ld,%ld:%ld]",uVar12 & 0xffffffff,
              lVar9,j[lVar32],lVar33,plVar16[nv * 2 + icode * 2 + uVar12],
              plVar16[nv * 2 + icode * 3 + uVar12],plVar16[nv * 2 + icode * 4 + uVar12]);
      pnga_error(err_string,g_a);
      lVar11 = j[lVar32];
      lVar20 = plVar16[nv * 2 + icode * 3 + uVar12];
      lVar9 = i[lVar32];
      lVar33 = plVar16[nv * 2 + icode + uVar12];
    }
    else {
      lVar11 = j[lVar32];
      lVar20 = plVar16[nv * 2 + icode * 3 + uVar12];
      if ((lVar11 < lVar20) || (plVar16[nv * 2 + icode * 4 + uVar12] < lVar11)) goto LAB_0017825b;
    }
    *(long *)(plVar10[uVar12] + lVar23 * 8) =
         (((lVar11 - lVar20) * plVar16[nv * 2 + icode * 5 + uVar12] + lVar9) - lVar33) *
         (long)iVar14 + plVar16[nv * 2 + uVar12];
    lVar32 = lVar32 + 1;
    v = (void *)((long)v + (long)iVar14);
    if (nv == lVar32) {
      switch(GA[lVar34].distr_type) {
      case 0:
        if (0 < icode) {
          lVar30 = 0;
          do {
            desc.src_ptr_array = (void **)plVar10[lVar30];
            desc.dst_ptr_array = (void **)plVar10[icode + lVar30];
            uVar12 = *(ulong *)((long)__ptr + lVar30 * 8 + lVar15);
            desc.ptr_array_len = *(int *)((long)__ptr + uVar12 * 8 + lVar5);
            if (iVar3 < 0) {
              if (0 < GA[lVar34].num_rstrctd) {
                uVar12 = GA[lVar34].rstrctd_list[uVar12];
              }
            }
            else {
              uVar12 = (ulong)(uint)PGRP_LIST[lVar31].inv_map_proc_list[uVar12];
            }
            desc.bytes = iVar14;
            iVar7 = ARMCI_GetV(&desc,1,(int)uVar12);
            if (iVar7 != 0) {
              pnga_error("gather failed in armci",(long)iVar7);
            }
            lVar30 = lVar30 + 1;
          } while (icode != lVar30);
        }
        break;
      case 1:
        if (0 < icode) {
          lVar34 = 0;
          do {
            desc.src_ptr_array = (void **)plVar10[lVar34];
            desc.dst_ptr_array = (void **)plVar10[icode + lVar34];
            lVar32 = *(long *)((long)__ptr + lVar34 * 8 + lVar15);
            uVar12 = lVar32 % lVar30;
            desc.ptr_array_len = *(int *)((long)__ptr + lVar32 * 8 + lVar5);
            if (-1 < iVar3) {
              uVar12 = (ulong)(uint)PGRP_LIST[lVar31].inv_map_proc_list[uVar12];
            }
            desc.bytes = iVar14;
            iVar7 = ARMCI_GetV(&desc,1,(int)uVar12);
            if (iVar7 != 0) {
              pnga_error("gather failed in armci",(long)iVar7);
            }
            lVar34 = lVar34 + 1;
          } while (icode != lVar34);
        }
        break;
      case 2:
        if (0 < icode) {
          lVar30 = 0;
          do {
            desc.src_ptr_array = (void **)plVar10[lVar30];
            desc.dst_ptr_array = (void **)plVar10[icode + lVar30];
            lVar32 = *(long *)((long)__ptr + lVar30 * 8 + lVar15);
            desc.ptr_array_len = *(int *)((long)__ptr + lVar32 * 8 + lVar5);
            sVar2 = GA[lVar34].ndim;
            uVar22 = (uint)sVar2;
            lVar21 = GA[lVar34].num_blocks[0];
            lVar9 = (long)(int)lVar32 % lVar21;
            if (1 < (int)uVar22) {
              lVar33 = 0;
              lVar23 = lVar9;
              do {
                lVar32 = ((int)lVar32 - lVar23) / lVar21;
                lVar21 = GA[g_a + 1000].num_blocks[lVar33 + 1];
                lVar23 = (long)(int)lVar32 % lVar21;
                *(long *)(err_string + lVar33 * 8 + 8) = lVar23;
                lVar33 = lVar33 + 1;
              } while ((ulong)uVar22 - 1 != lVar33);
            }
            err_string._0_8_ = lVar9 % (long)GA[lVar34].nblock[0];
            err_string._8_8_ = (long)err_string._8_8_ % (long)GA[lVar34].nblock[1];
            if (sVar2 < 1) {
              uVar12 = _lo[(long)(int)uVar22 + -1];
            }
            else {
              uVar12 = 0;
              do {
                _lo[uVar12] = *(long *)(err_string + uVar12 * 8) %
                              (long)GA[g_a + 1000].nblock[uVar12];
                uVar12 = uVar12 + 1;
              } while (uVar22 != uVar12);
              uVar12 = _lo[(long)(int)uVar22 + -1];
              if (1 < sVar2) {
                uVar24 = (ulong)(uVar22 - 2);
                do {
                  uVar12 = (long)GA[g_a + 1000].nblock[uVar24] * uVar12 + _lo[uVar24];
                  bVar35 = uVar24 != 0;
                  uVar24 = uVar24 - 1;
                } while (bVar35);
              }
            }
            if (-1 < iVar3) {
              uVar12 = (ulong)(uint)PGRP_LIST[lVar31].inv_map_proc_list[uVar12];
            }
            desc.bytes = iVar14;
            iVar7 = ARMCI_GetV(&desc,1,(int)uVar12);
            if (iVar7 != 0) {
              pnga_error("gather failed in armci",(long)iVar7);
            }
            lVar30 = lVar30 + 1;
          } while (lVar30 != icode);
        }
        break;
      case 3:
      case 4:
        if (0 < icode) {
          lVar30 = 0;
          do {
            desc.src_ptr_array = (void **)plVar10[lVar30];
            desc.dst_ptr_array = (void **)plVar10[icode + lVar30];
            lVar32 = *(long *)((long)__ptr + lVar30 * 8 + lVar15);
            desc.ptr_array_len = *(int *)((long)__ptr + lVar32 * 8 + lVar5);
            sVar2 = GA[lVar34].ndim;
            uVar22 = (uint)sVar2;
            lVar21 = GA[lVar34].num_blocks[0];
            lVar9 = (long)(int)lVar32 % lVar21;
            if (1 < (int)uVar22) {
              lVar33 = 0;
              lVar23 = lVar9;
              do {
                lVar32 = ((int)lVar32 - lVar23) / lVar21;
                lVar21 = GA[g_a + 1000].num_blocks[lVar33 + 1];
                lVar23 = (long)(int)lVar32 % lVar21;
                *(long *)(err_string + lVar33 * 8 + 8) = lVar23;
                lVar33 = lVar33 + 1;
              } while ((ulong)uVar22 - 1 != lVar33);
            }
            err_string._0_8_ = lVar9 % (long)GA[lVar34].nblock[0];
            err_string._8_8_ = (long)err_string._8_8_ % (long)GA[lVar34].nblock[1];
            if (sVar2 < 1) {
              uVar12 = _lo[(long)(int)uVar22 + -1];
            }
            else {
              uVar12 = 0;
              do {
                _lo[uVar12] = *(long *)(err_string + uVar12 * 8) %
                              (long)GA[g_a + 1000].nblock[uVar12];
                uVar12 = uVar12 + 1;
              } while (uVar22 != uVar12);
              uVar12 = _lo[(long)(int)uVar22 + -1];
              if (1 < sVar2) {
                uVar24 = (ulong)(uVar22 - 2);
                do {
                  uVar12 = (long)GA[g_a + 1000].nblock[uVar24] * uVar12 + _lo[uVar24];
                  bVar35 = uVar24 != 0;
                  uVar24 = uVar24 - 1;
                } while (bVar35);
              }
            }
            if (-1 < iVar3) {
              uVar12 = (ulong)(uint)PGRP_LIST[lVar31].inv_map_proc_list[uVar12];
            }
            desc.bytes = iVar14;
            iVar7 = ARMCI_GetV(&desc,1,(int)uVar12);
            if (iVar7 != 0) {
              pnga_error("gather failed in armci",(long)iVar7);
            }
            lVar30 = lVar30 + 1;
          } while (lVar30 != icode);
        }
      }
      free(plVar10);
      free(__ptr);
      return;
    }
  } while( true );
}

Assistant:

void pnga_gather2d(Integer g_a, void *v, Integer *i, Integer *j,
                         Integer nv)
{
    Integer k, kk, proc, item_size;
    Integer *aproc, naproc; /* active processes and numbers */
    Integer *map;           /* map the active processes to allocated space */
    char *buf1, *buf2;
    Integer handle = g_a + GA_OFFSET;
    Integer nproc, p_handle, iproc;
    
    Integer *count;   /* counters for each process */
    Integer *nelem;   /* number of elements for each process */
    /* source and destination pointers for each process */
    void ***ptr_src, ***ptr_dst; 
    void **ptr_org; /* the entire pointer array */
    armci_giov_t desc;
    Integer *ilo, *ihi, *jlo, *jhi, *ldp, *owner;
    Integer lo[2], hi[2];
    char **ptr_ref;
    Integer num_blocks=0;
    Integer subscrpt[2];
    
    if (nv < 1) return;

    ga_check_handleM(g_a, "ga_gather");
    
    GAstat.numgat++;

    /* determine how many processors are associated with array */
    p_handle = GA[handle].p_handle;
    if (p_handle < 0) {
      nproc = GAnproc;
      if (GA[handle].num_rstrctd > 0) {
        nproc = GA[handle].num_rstrctd;
      }
    } else {
      nproc = PGRP_LIST[p_handle].map_nproc;
    }

    /* allocate temp memory */
    if (GA[handle].distr_type == REGULAR) {
      buf1 = malloc((int)(nproc *4  + nv)*  (sizeof(Integer)));
      if(buf1 == NULL) pnga_error("malloc failed", 3*nproc);
    } else {
      num_blocks = GA[handle].block_total;
      buf1 = malloc((int)(num_blocks *4  + nv)*  (sizeof(Integer)));
      if(buf1 == NULL) pnga_error("malloc failed", 3*num_blocks);
    }
    
    owner = (Integer *)buf1; 
    count = owner+ nv;
    if (GA[handle].distr_type == REGULAR) {
      nelem = count + nproc;
      aproc = count + 2 * nproc;
      map =   count + 3 * nproc;
    } else {
      nelem = count + num_blocks;
      aproc = count + 2 * num_blocks;
      map =   count + 3 * num_blocks;
    }
   
    if (GA[handle].distr_type == REGULAR) {
      /* initialize the counters and nelem */
      for(kk=0; kk<nproc; kk++) {
        count[kk] = 0; nelem[kk] = 0;
      }
    } else {
      for(kk=0; kk<num_blocks; kk++) {
        count[kk] = 0; nelem[kk] = 0;
      }
    }

    /* find proc or block that owns the (i,j) element; store it in temp: */
    if (GA[handle].num_rstrctd == 0) {
      for(k=0; k< nv; k++) {
        subscrpt[0] = *(i+k);
        subscrpt[1] = *(j+k);
        if(! pnga_locate(g_a, subscrpt, owner+k)){
          char err_string[ERR_STR_LEN];
          sprintf(err_string,"invalid i/j=(%ld,%ld)", (long)i[k], (long)j[k]);
          pnga_error(err_string, g_a);
        }
        iproc = owner[k];
        nelem[iproc]++;
      }
    } else {
      for(k=0; k< nv; k++) {
        subscrpt[0] = *(i+k);
        subscrpt[1] = *(j+k);
        if(! pnga_locate(g_a, subscrpt, owner+k)){
          char err_string[ERR_STR_LEN];
          sprintf(err_string,"invalid i/j=(%ld,%ld)", (long)i[k], (long)j[k]);
          pnga_error(err_string, g_a);
        }
        iproc = GA[handle].rank_rstrctd[owner[k]];
        nelem[iproc]++;
      }
    }

    naproc = 0;
    if (GA[handle].distr_type == REGULAR) {
      for(k=0; k<nproc; k++) if(nelem[k] > 0) {
        aproc[naproc] = k;
        map[k] = naproc;
        naproc ++;
      }
    } else {
      for(k=0; k<num_blocks; k++) if(nelem[k] > 0) {
        aproc[naproc] = k;
        map[k] = naproc;
        naproc ++;
      }
    }
    GAstat.numgat_procs += naproc;
    
    buf2 = malloc((int)(2*naproc*sizeof(void **) + 2*nv*sizeof(void *) +
                      5*naproc*sizeof(Integer) + naproc*sizeof(char*)));
    if(buf2 == NULL) pnga_error("malloc failed", naproc);
 
    ptr_src = (void ***)buf2;
    ptr_dst = (void ***)(buf2 + naproc*sizeof(void **));
    ptr_org = (void **)(buf2 + 2*naproc*sizeof(void **));
    ptr_ref = (char **)(buf2+2*naproc*sizeof(void **)+2*nv*sizeof(void *));
    ilo = (Integer *)(((char*)ptr_ref) + naproc*sizeof(char*));
    ihi = ilo + naproc;
    jlo = ihi + naproc;
    jhi = jlo + naproc;
    ldp = jhi + naproc;

    if (GA[handle].distr_type == REGULAR) {
      for(kk=0; kk<naproc; kk++) {
        iproc = aproc[kk];
        if (GA[handle].num_rstrctd > 0)
          iproc = GA[handle].rstrctd_list[iproc];
        pnga_distribution(g_a, iproc, lo, hi);
        ilo[kk] = lo[0];
        jlo[kk] = lo[1];
        ihi[kk] = hi[0];
        jhi[kk] = hi[1];

        /* get address of the first element owned by proc */
        gaShmemLocation(aproc[kk], g_a, ilo[kk], jlo[kk], &(ptr_ref[kk]),
            &(ldp[kk]));
      }
    } else {
      for(kk=0; kk<naproc; kk++) {
        iproc = aproc[kk];
        pnga_distribution(g_a, iproc, lo, hi);
        ilo[kk] = lo[0];
        jlo[kk] = lo[1];
        ihi[kk] = hi[0];
        jhi[kk] = hi[1];

        /* get address of the first element owned by proc */
        pnga_access_block_ptr(g_a, iproc, &(ptr_ref[kk]), &(ldp[kk]));
        pnga_release_block(g_a, iproc);
      }
    }
    
    item_size = GA[GA_OFFSET + g_a].elemsize;
    GAbytes.gattot += (double)item_size*nv;
    /*This stuff is probably completely wrong. Doesn't affect performance,
     * just statistics. */
    iproc = owner[GAme];
    GAbytes.gatloc += (double)item_size * nelem[iproc];

    ptr_src[0] = ptr_org; ptr_dst[0] = ptr_org + nv;
    for(k=1; k<naproc; k++) {
        ptr_src[k] = ptr_src[k-1] + nelem[aproc[k-1]];
        ptr_dst[k] = ptr_dst[k-1] + nelem[aproc[k-1]];
    }
    
    for(k=0; k<nv; k++){
        Integer this_count;
        proc = owner[k];
        if (GA[handle].num_rstrctd > 0)
          proc = GA[handle].rank_rstrctd[owner[k]];
        this_count = count[proc]; 
        count[proc]++;
        proc = map[proc]; 
        ptr_dst[proc][this_count] = ((char*)v) + k * item_size;

        if(i[k] < ilo[proc] || i[k] > ihi[proc]  ||
           j[k] < jlo[proc] || j[k] > jhi[proc]){
          char err_string[ERR_STR_LEN];
          sprintf(err_string,"proc=%d invalid i/j=(%ld,%ld)><[%ld:%ld,%ld:%ld]",
                 (int)proc,(long)i[k],(long)j[k],
                 (long)ilo[proc],(long)ihi[proc],
                 (long)jlo[proc], (long)jhi[proc]);
            pnga_error(err_string, g_a);
        }
        ptr_src[proc][this_count] = ptr_ref[proc] + item_size *
            ((j[k] - jlo[proc])* ldp[proc] + i[k] - ilo[proc]);
    }
    /* source and destination pointers are ready for all processes */
    if (GA[handle].distr_type == REGULAR) {
      for(k=0; k<naproc; k++) {
        int rc;

        desc.bytes = (int)item_size;
        desc.src_ptr_array = ptr_src[k];
        desc.dst_ptr_array = ptr_dst[k];
        desc.ptr_array_len = (int)nelem[aproc[k]];
        if (p_handle < 0) {
          iproc = aproc[k];
          if (GA[handle].num_rstrctd > 0)
            iproc = GA[handle].rstrctd_list[iproc];
        } else {
          iproc = PGRP_LIST[p_handle].inv_map_proc_list[aproc[k]]; 
        }
        rc=ARMCI_GetV(&desc, 1, (int)iproc);
        if(rc) pnga_error("gather failed in armci",rc);
      }
    } else if (GA[handle].distr_type == BLOCK_CYCLIC) {
      for(k=0; k<naproc; k++) {
        int rc;

        desc.bytes = (int)item_size;
        desc.src_ptr_array = ptr_src[k];
        desc.dst_ptr_array = ptr_dst[k];
        desc.ptr_array_len = (int)nelem[aproc[k]];
        iproc = aproc[k];
        iproc = iproc%nproc;
        if (p_handle >= 0) {
          iproc = PGRP_LIST[p_handle].inv_map_proc_list[iproc]; 
        }
        rc=ARMCI_GetV(&desc, 1, (int)iproc);
        if(rc) pnga_error("gather failed in armci",rc);
      }
    } else if (GA[handle].distr_type == SCALAPACK) {
      Integer index[MAXDIM];
      for(k=0; k<naproc; k++) {
        int rc;

        desc.bytes = (int)item_size;
        desc.src_ptr_array = ptr_src[k];
        desc.dst_ptr_array = ptr_dst[k];
        desc.ptr_array_len = (int)nelem[aproc[k]];
        iproc = aproc[k];
        gam_find_block_indices(handle, iproc, index);
        index[0] = index[0]%GA[handle].nblock[0];
        index[1] = index[1]%GA[handle].nblock[1];
        gam_find_proc_from_sl_indices(handle,iproc,index);
        if (p_handle >= 0) {
          iproc = PGRP_LIST[p_handle].inv_map_proc_list[iproc]; 
        }
        rc=ARMCI_GetV(&desc, 1, (int)iproc);
        if(rc) pnga_error("gather failed in armci",rc);
      }
    } else if (GA[handle].distr_type == TILED ||
        GA[handle].distr_type == TILED_IRREG) {
      Integer index[MAXDIM];
      for(k=0; k<naproc; k++) {
        int rc;

        desc.bytes = (int)item_size;
        desc.src_ptr_array = ptr_src[k];
        desc.dst_ptr_array = ptr_dst[k];
        desc.ptr_array_len = (int)nelem[aproc[k]];
        iproc = aproc[k];
        gam_find_block_indices(handle, iproc, index);
        index[0] = index[0]%GA[handle].nblock[0];
        index[1] = index[1]%GA[handle].nblock[1];
        gam_find_tile_proc_from_indices(handle,iproc,index);
        if (p_handle >= 0) {
          iproc = PGRP_LIST[p_handle].inv_map_proc_list[iproc]; 
        }
        rc=ARMCI_GetV(&desc, 1, (int)iproc);
        if(rc) pnga_error("gather failed in armci",rc);
      }
    }

    free(buf2);
    free(buf1);
}